

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph.h
# Opt level: O2

ostream * data_structures::operator<<(ostream *out,WeightedDigraph<int,_int> *graph)

{
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar1;
  pointer pWVar2;
  ostream *poVar3;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *e;
  pointer pWVar4;
  pointer ppRVar5;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  nodes;
  _Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  local_60;
  _Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  local_48;
  
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getAllNodes
            ((vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
              *)&local_48,&(graph->super_WeightedGraph<int,_int>)._tree);
  for (ppRVar5 = local_48._M_impl.super__Vector_impl_data._M_start;
      ppRVar5 != local_48._M_impl.super__Vector_impl_data._M_finish; ppRVar5 = ppRVar5 + 1) {
    pRVar1 = *ppRVar5;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,(pRVar1->element).key);
    std::operator<<(poVar3,": ");
    SymbolTable<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
    ::values((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
              *)&local_60,&(pRVar1->element).value._table);
    pWVar2 = local_60._M_impl.super__Vector_impl_data._M_finish;
    for (pWVar4 = local_60._M_impl.super__Vector_impl_data._M_start; pWVar4 != pWVar2;
        pWVar4 = pWVar4 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,(pWVar4->to->element).key);
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,pWVar4->weight);
      poVar3 = std::operator<<(poVar3,")");
      std::operator<<(poVar3," ");
    }
    std::
    _Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
    ::~_Vector_base(&local_60);
    std::endl<char,std::char_traits<char>>(out);
  }
  std::
  _Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::~_Vector_base(&local_48);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, WeightedDigraph<T, Weight> &graph) {
            auto nodes = graph._tree.getAllNodes();
            for (auto node: nodes) {
                out << node->element.key << ": ";
                for (auto &e: node->element.value.adjEdges()) {
                    out << e.to->element.key << "(" << e.weight << ")" << " ";
                }
                out << std::endl;
            }
            return out;
        }